

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::anon_unknown_1::reduceu<float>
               (float *src,int sstride,int uw,int vw,float *dst,int dstride,int nchan)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  float *in_RDI;
  float *in_R8;
  int in_R9D;
  float fVar4;
  int in_stack_00000008;
  float *pixend;
  float *rowend;
  float *end;
  int drowskip;
  int srowskip;
  int rowlen;
  float *local_20;
  float *local_8;
  
  iVar1 = in_EDX * in_stack_00000008;
  local_20 = in_R8;
  for (local_8 = in_RDI; local_8 != in_RDI + in_ECX * (in_ESI / 4);
      local_8 = local_8 + (in_ESI / 4 - iVar1)) {
    pfVar2 = local_8 + iVar1;
    for (; local_8 != pfVar2; local_8 = local_8 + in_stack_00000008) {
      pfVar3 = local_8 + in_stack_00000008;
      for (; local_8 != pfVar3; local_8 = local_8 + 1) {
        fVar4 = halve(*local_8 + local_8[in_stack_00000008]);
        *local_20 = fVar4;
        local_20 = local_20 + 1;
      }
    }
    local_20 = local_20 + (in_R9D / 4 - iVar1 / 2);
  }
  return;
}

Assistant:

inline void reduceu(const T* src, int sstride, int uw, int vw,
                        T* dst, int dstride, int nchan)
    {
        sstride /= (int)sizeof(T);
        dstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int srowskip = sstride - rowlen;
        int drowskip = dstride - rowlen/2;
        for (const T* end = src + vw*sstride; src != end;
             src += srowskip, dst += drowskip)
            for (const T* rowend = src + rowlen; src != rowend; src += nchan)
                for (const T* pixend = src+nchan; src != pixend; src++)
                    *dst++ = T(halve(src[0] + src[nchan]));
    }